

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O0

uint8_t __thiscall m6502::SBC(m6502 *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint16_t tmp;
  uint16_t value;
  m6502 *this_local;
  
  fetch(this);
  bVar1 = this->fetched;
  bVar2 = this->a;
  bVar3 = GetFlag(this,C);
  uVar4 = (ushort)bVar2 + (bVar1 ^ 0xff) + (ushort)bVar3;
  SetFlag(this,C,0xff < uVar4);
  SetFlag(this,Z,(uVar4 & 0xff) == 0);
  SetFlag(this,N,(uVar4 & 0x80) != 0);
  SetFlag(this,V,(((this->a ^ this->fetched) ^ 0xffff) & (this->a ^ uVar4) & 0x80) != 0);
  this->a = (uint8_t)uVar4;
  return '\x01';
}

Assistant:

uint8_t SBC()
  {
    fetch();
    uint16_t value = (uint16_t)fetched ^ 0x00FFu;
    uint16_t tmp = (uint16_t)a + value + (uint16_t)GetFlag(C);
    SetFlag(C, tmp > 255);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    SetFlag(V, (~((uint16_t)a ^ (uint16_t)fetched) &
                ((uint16_t)a ^ (uint16_t)tmp)) &
                   0x0080u);
    a = tmp & 0x00FF;
    return 1;
  }